

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O2

CappedArray<char,_24UL> * __thiscall
kj::_::Stringifier::operator*
          (CappedArray<char,_24UL> *__return_storage_ptr__,Stringifier *this,float f)

{
  char *__s;
  int *piVar1;
  size_t sVar2;
  float fVar3;
  char *local_20;
  
  __return_storage_ptr__->currentSize = 0x18;
  __s = __return_storage_ptr__->content;
  if (INFINITY <= f) {
    builtin_strncpy(__s,"inf",4);
    goto LAB_002b79ff;
  }
  if (f <= -INFINITY) {
    builtin_strncpy(__s,"-inf",5);
    goto LAB_002b79ff;
  }
  if (NAN(f)) {
    builtin_strncpy(__s,"nan",4);
    goto LAB_002b79ff;
  }
  snprintf(__s,0x18,"%.*g",6);
  piVar1 = __errno_location();
  *piVar1 = 0;
  fVar3 = strtof(__s,&local_20);
  if (((*__s == '\0') || (*local_20 != '\0')) || (*piVar1 != 0)) {
LAB_002b79d2:
    snprintf(__s,0x18,"%.*g",(double)f,8);
  }
  else if ((fVar3 != f) || (NAN(fVar3) || NAN(f))) goto LAB_002b79d2;
  anon_unknown_1::DelocalizeRadix(__s);
  anon_unknown_1::RemovePlus(__s);
LAB_002b79ff:
  sVar2 = strlen(__s);
  __return_storage_ptr__->currentSize = sVar2;
  return __return_storage_ptr__;
}

Assistant:

CappedArray<char, kFloatToBufferSize> Stringifier::operator*(float f) const {
  CappedArray<char, kFloatToBufferSize> result;
  result.setSize(strlen(FloatToBuffer(f, result.begin())));
  return result;
}